

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O2

string * __thiscall
google::protobuf::util::converter::DoubleAsString_abi_cxx11_
          (string *__return_storage_ptr__,converter *this,double value)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  
  if (value < INFINITY) {
    if (-INFINITY < value) {
      if (!NAN(value)) {
        SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)this,value);
        return __return_storage_ptr__;
      }
      pcVar2 = "NaN";
      paVar1 = &local_11;
    }
    else {
      pcVar2 = "-Infinity";
      paVar1 = &local_12;
    }
  }
  else {
    pcVar2 = "Infinity";
    paVar1 = &local_13;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string DoubleAsString(double value) {
  if (value == std::numeric_limits<double>::infinity()) return "Infinity";
  if (value == -std::numeric_limits<double>::infinity()) return "-Infinity";
  if (std::isnan(value)) return "NaN";

  return SimpleDtoa(value);
}